

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_port_resp(Curl_easy *data,int ftpcode)

{
  int iVar1;
  connectdata *pcVar2;
  ftpport fcmd_00;
  ulong uVar3;
  CURLcode local_30;
  CURLcode result;
  ftpport fcmd;
  ftp_conn *ftpc;
  connectdata *conn;
  int ftpcode_local;
  Curl_easy *data_local;
  
  pcVar2 = data->conn;
  iVar1 = (pcVar2->proto).ftpc.count1;
  uVar3 = (long)ftpcode % 100 & 0xffffffff;
  if (ftpcode / 100 == 2) {
    Curl_infof(data,"Connect data stream actively",uVar3);
    _state(data,FTP_STOP);
    local_30 = ftp_dophase_done(data,false);
  }
  else {
    if (iVar1 == 0) {
      Curl_infof(data,"disabling EPRT usage",uVar3);
      *(ulong *)&(pcVar2->bits).field_0x4 = *(ulong *)&(pcVar2->bits).field_0x4 & 0xffffffffffefffff
      ;
    }
    fcmd_00 = iVar1 + PORT;
    if (fcmd_00 == DONE) {
      Curl_failf(data,"Failed to do PORT");
      local_30 = CURLE_FTP_PORT_FAILED;
    }
    else {
      local_30 = ftp_state_use_port(data,fcmd_00);
    }
  }
  return local_30;
}

Assistant:

static CURLcode ftp_state_port_resp(struct Curl_easy *data,
                                    int ftpcode)
{
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  ftpport fcmd = (ftpport)ftpc->count1;
  CURLcode result = CURLE_OK;

  /* The FTP spec tells a positive response should have code 200.
     Be more permissive here to tolerate deviant servers. */
  if(ftpcode / 100 != 2) {
    /* the command failed */

    if(EPRT == fcmd) {
      infof(data, "disabling EPRT usage");
      conn->bits.ftp_use_eprt = FALSE;
    }
    fcmd++;

    if(fcmd == DONE) {
      failf(data, "Failed to do PORT");
      result = CURLE_FTP_PORT_FAILED;
    }
    else
      /* try next */
      result = ftp_state_use_port(data, fcmd);
  }
  else {
    infof(data, "Connect data stream actively");
    state(data, FTP_STOP); /* end of DO phase */
    result = ftp_dophase_done(data, FALSE);
  }

  return result;
}